

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O3

void __thiscall UrsaClient::recv_res(UrsaClient *this,socket_t *socket)

{
  char cVar1;
  value_t vVar2;
  source_loc loc;
  _Alloc_hider _Var3;
  _Alloc_hider _Var4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  reference pvVar8;
  logger *this_00;
  reference pbVar9;
  const_reference pvVar10;
  int i;
  int iVar11;
  char *pcVar12;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> r;
  int ret;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  res;
  iteration_proxy_internal __end3;
  iteration_proxy_internal __end4;
  string result;
  undefined1 local_168 [32];
  ulong uStack_148;
  string local_140;
  long lStack_120;
  undefined1 local_118 [8];
  json_value local_110;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_108;
  undefined8 local_e8;
  undefined1 local_d8 [24];
  primitive_iterator_t local_c0;
  undefined8 local_b8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  long local_a8;
  char local_a0;
  undefined7 uStack_9f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  reference local_70;
  input_adapter local_68;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  
  local_b0._M_current = &local_a0;
  local_a8 = 0;
  local_a0 = '\0';
  do {
    s_try_recv<std::__cxx11::string>
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_168,socket);
    if (uStack_148._0_1_ == true) {
      std::__cxx11::string::_M_assign((string *)&local_b0);
    }
    else {
      check_task_status(this,&this->connection_id);
    }
    if ((uStack_148._0_1_ == true) &&
       (uStack_148 = uStack_148 & 0xffffffffffffff00,
       (undefined1 *)local_168._0_8_ != local_168 + 0x10)) {
      operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
    }
  } while (local_a8 == 0);
  nlohmann::detail::input_adapter::
  input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
            (&local_68,local_b0,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_b0._M_current + local_a8));
  local_48 = (code *)0x0;
  uStack_40 = 0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)local_118,&local_68,(parser_callback_t *)&local_58,true);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_68.ia.
      super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.ia.
               super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (this->raw_json == true) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::dump((string_t *)local_168,
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)local_118,4,' ',false);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_168._0_8_,local_168._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  else {
    pvVar8 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_118,"type");
    bVar5 = nlohmann::operator==<const_char_*,_0>(pvVar8,"select");
    if (bVar5) {
      local_168._8_8_ = (_Base_ptr)0x0;
      local_168._16_8_ = (pointer)0x0;
      local_168._24_8_ = 0x8000000000000000;
      local_168._0_8_ = local_118;
      if (local_118[0] ==
          (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           )0x1) {
        local_168._8_8_ =
             std::
             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
             ::_M_find_tr<char[9],void>
                       ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                         *)local_110.object,(char (*) [9])0x1a703e);
LAB_0012990f:
        local_108.m_it.object_iterator._M_node = (_Base_ptr)0x0;
        local_108.m_it.array_iterator._M_current = (pointer)0x0;
        local_108.m_it.primitive_iterator.m_it = -0x8000000000000000;
        if (local_118[0] ==
            (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             )0x2) goto LAB_00129949;
        if (local_118[0] ==
            (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             )0x1) {
          local_108.m_it.object_iterator._M_node =
               &((local_110.object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
        }
        else {
          local_108.m_it.primitive_iterator.m_it = 1;
        }
      }
      else {
        if (local_118[0] !=
            (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             )0x2) {
          local_168._24_8_ = 1;
          goto LAB_0012990f;
        }
        local_168._16_8_ =
             ((local_110.array)->
             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
LAB_00129949:
        local_108.m_it.primitive_iterator.m_it = -0x8000000000000000;
        local_108.m_it.object_iterator._M_node = (_Base_ptr)0x0;
        local_108.m_it.array_iterator._M_current =
             ((local_110.array)->
             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
      }
      local_108.m_object = (pointer)local_118;
      bVar5 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)local_168,&local_108);
      if (bVar5) {
        pvVar8 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)local_118,"result");
        local_168._0_8_ =
             nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)pvVar8,"files");
        local_168._8_8_ = (_Base_ptr)0x0;
        local_168._16_8_ = (pointer)0x0;
        local_168._24_8_ = 0x8000000000000000;
        cVar1 = *(char *)local_168._0_8_;
        if (cVar1 == '\0') {
          local_168._24_8_ = 1;
LAB_0012a064:
          local_108.m_it.object_iterator._M_node = (_Base_ptr)0x0;
          local_108.m_it.array_iterator._M_current = (pointer)0x0;
          local_108.m_it.primitive_iterator.m_it = 1;
        }
        else if (cVar1 == '\x02') {
          local_168._16_8_ =
               (((json_value *)(local_168._0_8_ + 8))->array->
               super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
          local_108.m_it.object_iterator._M_node = (_Base_ptr)0x0;
          local_108.m_it.primitive_iterator.m_it = -0x8000000000000000;
          local_108.m_it.array_iterator._M_current =
               (((json_value *)(local_168._0_8_ + 8))->array->
               super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          if (cVar1 != '\x01') {
            local_168._24_8_ = 0;
            goto LAB_0012a064;
          }
          local_168._8_8_ =
               (((json_value *)(local_168._0_8_ + 8))->object->_M_t)._M_impl.super__Rb_tree_header.
               _M_header._M_left;
          local_108.m_it.array_iterator._M_current = (pointer)0x0;
          local_108.m_it.primitive_iterator.m_it = -0x8000000000000000;
          local_108.m_it.object_iterator._M_node =
               &(((json_value *)(local_168._0_8_ + 8))->object->_M_t)._M_impl.super__Rb_tree_header.
                _M_header;
        }
        local_108.m_object = (pointer)local_168._0_8_;
        while (bVar5 = nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                       ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                     *)local_168,&local_108), !bVar5) {
          pbVar9 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                *)local_168);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_140,pbVar9);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_140._M_dataplus._M_p,
                              local_140._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p,
                            (ulong)(local_140.field_2._M_allocated_capacity + 1));
          }
          if (*(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                *)local_168._0_8_ ==
              (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               )0x2) {
            local_168._16_8_ = local_168._16_8_ + 0x10;
          }
          else if (*(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                     *)local_168._0_8_ ==
                   (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                    )0x1) {
            local_168._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_168._8_8_);
          }
          else {
            local_168._24_8_ = local_168._24_8_ + 1;
          }
        }
        goto LAB_00129827;
      }
    }
    pvVar8 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_118,"type");
    bVar5 = nlohmann::operator==<const_char_*,_0>(pvVar8,"topology");
    if (bVar5) {
      pvVar8 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)local_118,"result");
      local_168._0_8_ =
           nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)pvVar8,"datasets");
      cVar1 = *(char *)local_168._0_8_;
      if (cVar1 == '\x02') {
        local_168._16_8_ =
             (((json_value *)(local_168._0_8_ + 8))->array->
             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        local_108.m_it.object_iterator._M_node = (_Base_ptr)0x0;
        local_168._8_8_ = (_Base_ptr)0x0;
        local_108.m_it.primitive_iterator.m_it = -0x8000000000000000;
        local_168._24_8_ = 0x8000000000000000;
        local_108.m_it.array_iterator._M_current =
             (((json_value *)(local_168._0_8_ + 8))->array->
             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
      }
      else if (cVar1 == '\x01') {
        local_168._8_8_ =
             (((json_value *)(local_168._0_8_ + 8))->object->_M_t)._M_impl.super__Rb_tree_header.
             _M_header._M_left;
        local_108.m_it.array_iterator._M_current = (pointer)0x0;
        local_168._16_8_ = (pointer)0x0;
        local_108.m_it.primitive_iterator.m_it = -0x8000000000000000;
        local_168._24_8_ = 0x8000000000000000;
        local_108.m_it.object_iterator._M_node =
             &(((json_value *)(local_168._0_8_ + 8))->object->_M_t)._M_impl.super__Rb_tree_header.
              _M_header;
      }
      else {
        local_168._25_7_ = 0;
        local_168[0x18] = cVar1 == '\0';
        local_168._16_8_ = (pointer)0x0;
        local_168._8_8_ = (_Base_ptr)0x0;
        local_108.m_it.primitive_iterator.m_it = 1;
        local_108.m_it.array_iterator._M_current = (pointer)0x0;
        local_108.m_it.object_iterator._M_node = (_Base_ptr)0x0;
      }
      uStack_148 = 0;
      local_e8 = 0;
      local_108.m_object = (pointer)local_168._0_8_;
      while (bVar5 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                   *)local_168,&local_108), !bVar5) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"dataset ",8);
        nlohmann::detail::
        iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::iteration_proxy_internal::key(&local_140,(iteration_proxy_internal *)local_168);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_140._M_dataplus._M_p,
                            local_140._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,
                          (ulong)(local_140.field_2._M_allocated_capacity + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
        *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 10;
        pbVar9 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                              *)local_168);
        pvVar8 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)pbVar9,"file_count");
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                  (pvVar8,(int *)&local_140);
        poVar7 = (ostream *)
                 std::ostream::operator<<((ostream *)&std::cout,(int)local_140._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
        pbVar9 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                              *)local_168);
        local_140._M_dataplus._M_p =
             (pointer)nlohmann::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                  *)pbVar9,"indexes");
        vVar2 = ((reference)local_140._M_dataplus._M_p)->m_type;
        if (vVar2 == array) {
          local_140.field_2._M_allocated_capacity =
               (size_type)
               (((((reference)local_140._M_dataplus._M_p)->m_value).array)->
               super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
          local_140.field_2._8_8_ = 0x8000000000000000;
          local_d8._16_8_ =
               (((((reference)local_140._M_dataplus._M_p)->m_value).array)->
               super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          local_c0.m_it = -0x8000000000000000;
LAB_00129ebb:
          local_140._M_string_length = 0;
          local_d8._8_8_ = (_Base_ptr)0x0;
        }
        else {
          if (vVar2 != object) {
            local_140.field_2._9_7_ = 0;
            local_140.field_2._M_local_buf[8] = vVar2 == null;
            local_140.field_2._M_allocated_capacity = 0;
            local_c0.m_it = 1;
            local_d8._16_8_ = (pointer)0x0;
            goto LAB_00129ebb;
          }
          local_140._M_string_length =
               (size_type)
               (((((reference)local_140._M_dataplus._M_p)->m_value).object)->_M_t)._M_impl.
               super__Rb_tree_header._M_header._M_left;
          local_140.field_2._M_allocated_capacity = 0;
          local_140.field_2._8_8_ = 0x8000000000000000;
          local_d8._8_8_ =
               &(((((reference)local_140._M_dataplus._M_p)->m_value).object)->_M_t)._M_impl.
                super__Rb_tree_header;
          local_d8._16_8_ = (pointer)0x0;
          local_c0.m_it = -0x8000000000000000;
        }
        lStack_120 = 0;
        local_b8 = 0;
        local_d8._0_8_ = local_140._M_dataplus._M_p;
        while (bVar5 = nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                       ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                     *)&local_140,
                                    (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                     *)local_d8), !bVar5) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
          pbVar9 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                *)&local_140);
          pvVar8 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)pbVar9,"type");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_90,pvVar8);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_90._M_dataplus._M_p,
                              local_90._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if (*local_140._M_dataplus._M_p == '\x02') {
            local_140.field_2._M_allocated_capacity = local_140.field_2._M_allocated_capacity + 0x10
            ;
          }
          else if (*local_140._M_dataplus._M_p == '\x01') {
            local_140._M_string_length =
                 std::_Rb_tree_increment((_Rb_tree_node_base *)local_140._M_string_length);
          }
          else {
            local_140.field_2._8_8_ = local_140.field_2._8_8_ + 1;
          }
          lStack_120 = lStack_120 + 1;
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
        std::ostream::put(-0x68);
        std::ostream::flush();
        if (*(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              *)local_168._0_8_ ==
            (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             )0x2) {
          local_168._16_8_ = local_168._16_8_ + 0x10;
        }
        else if (*(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   *)local_168._0_8_ ==
                 (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  )0x1) {
          local_168._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_168._8_8_);
        }
        else {
          local_168._24_8_ = local_168._24_8_ + 1;
        }
        uStack_148 = uStack_148 + 1;
      }
      goto LAB_00129827;
    }
    pvVar8 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_118,"type");
    bVar5 = nlohmann::operator==<const_char_*,_0>(pvVar8,"status");
    if (bVar5) {
      pvVar8 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)local_118,"result");
      local_168._0_8_ =
           nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)pvVar8,"tasks");
      cVar1 = *(char *)local_168._0_8_;
      if (cVar1 == '\x02') {
        local_168._16_8_ =
             (((json_value *)(local_168._0_8_ + 8))->array->
             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        local_108.m_it.object_iterator._M_node = (_Base_ptr)0x0;
        local_168._8_8_ = (_Base_ptr)0x0;
        local_108.m_it.primitive_iterator.m_it = -0x8000000000000000;
        local_168._24_8_ = 0x8000000000000000;
        local_108.m_it.array_iterator._M_current =
             (((json_value *)(local_168._0_8_ + 8))->array->
             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
      }
      else if (cVar1 == '\x01') {
        local_168._8_8_ =
             (((json_value *)(local_168._0_8_ + 8))->object->_M_t)._M_impl.super__Rb_tree_header.
             _M_header._M_left;
        local_108.m_it.array_iterator._M_current = (pointer)0x0;
        local_168._16_8_ = (pointer)0x0;
        local_108.m_it.primitive_iterator.m_it = -0x8000000000000000;
        local_168._24_8_ = 0x8000000000000000;
        local_108.m_it.object_iterator._M_node =
             &(((json_value *)(local_168._0_8_ + 8))->object->_M_t)._M_impl.super__Rb_tree_header.
              _M_header;
      }
      else {
        local_168._25_7_ = 0;
        local_168[0x18] = cVar1 == '\0';
        local_168._16_8_ = (pointer)0x0;
        local_168._8_8_ = (_Base_ptr)0x0;
        local_108.m_it.primitive_iterator.m_it = 1;
        local_108.m_it.array_iterator._M_current = (pointer)0x0;
        local_108.m_it.object_iterator._M_node = (_Base_ptr)0x0;
      }
      uStack_148 = 0;
      local_e8 = 0;
      local_108.m_object = (pointer)local_168._0_8_;
      while( true ) {
        bVar5 = nlohmann::detail::
                iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                              *)local_168,&local_108);
        if (bVar5) break;
        pbVar9 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                              *)local_168);
        pvVar10 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                              *)pbVar9,"work_estimated");
        nlohmann::detail::
        get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_unsigned_long,_0>
                  (pvVar10,(unsigned_long *)&local_140);
        _Var3._M_p = local_140._M_dataplus._M_p;
        pvVar10 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                              *)pbVar9,"work_done");
        nlohmann::detail::
        get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_unsigned_long,_0>
                  (pvVar10,(unsigned_long *)&local_140);
        _Var4._M_p = local_140._M_dataplus._M_p;
        pvVar10 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                              *)pbVar9,"id");
        nlohmann::detail::
        get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_unsigned_long,_0>
                  (pvVar10,(unsigned_long *)&local_140);
        local_70 = (reference)local_140._M_dataplus._M_p;
        if ((reference)_Var3._M_p == (reference)0x0) {
          iVar6 = 0;
        }
        else {
          iVar6 = (int)((ulong)((long)_Var4._M_p * 10) / (ulong)_Var3._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"task ",5);
        *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 9;
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [",2);
        iVar11 = 0;
        do {
          pcVar12 = " ";
          if (iVar11 < iVar6) {
            pcVar12 = "#";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar12,1);
          iVar11 = iVar11 + 1;
        } while (iVar11 != 10);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"] ",2);
        pvVar10 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                              *)pbVar9,"request");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_140,pvVar10);
        if (local_140._M_string_length < (_Base_ptr)0x6f) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,local_140._M_dataplus._M_p,local_140._M_string_length);
        }
        else {
          std::__cxx11::string::substr((ulong)local_d8,(ulong)&local_140);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)local_d8._0_8_,local_d8._8_8_);
          if ((reference)local_d8._0_8_ != (reference)(local_d8 + 0x10)) {
            operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (...) ",7);
          std::__cxx11::string::substr((ulong)local_d8,(ulong)&local_140);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)local_d8._0_8_,local_d8._8_8_);
          if ((reference)local_d8._0_8_ != (reference)(local_d8 + 0x10)) {
            operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
          }
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
        std::ostream::put(-0x68);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,
                          (ulong)(local_140.field_2._M_allocated_capacity + 1));
        }
        if (*(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              *)local_168._0_8_ ==
            (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             )0x2) {
          local_168._16_8_ = local_168._16_8_ + 0x10;
        }
        else if (*(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   *)local_168._0_8_ ==
                 (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  )0x1) {
          local_168._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_168._8_8_);
        }
        else {
          local_168._24_8_ = local_168._24_8_ + 1;
        }
        uStack_148 = uStack_148 + 1;
      }
      goto LAB_00129827;
    }
    pvVar8 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_118,"type");
    bVar5 = nlohmann::operator==<const_char_*,_0>(pvVar8,"error");
    if (bVar5) {
      pvVar8 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)local_118,"error");
      pvVar8 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)pvVar8,"message");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                 pvVar8);
      this_00 = spdlog::default_logger_raw();
      local_108.m_object = (reference)0x0;
      local_108.m_it.object_iterator._M_node = (_Base_ptr)0x0;
      local_108.m_it.array_iterator._M_current = (pointer)0x0;
      loc.funcname = (char *)0x0;
      loc.filename = (char *)0x0;
      loc.line = 0;
      loc._12_4_ = 0;
      spdlog::logger::
      log<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                (this_00,loc,err,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
    }
    else {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::dump((string_t *)local_168,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)local_118,4,' ',false);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_168._0_8_,local_168._8_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
  }
  if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
    operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
  }
LAB_00129827:
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_118 + 8),(value_t)local_118[0]);
  if (local_b0._M_current != &local_a0) {
    operator_delete(local_b0._M_current,CONCAT71(uStack_9f,local_a0) + 1);
  }
  return;
}

Assistant:

void UrsaClient::recv_res(zmq::socket_t *socket) {
    std::string result;
    while (result.empty()) {
        auto r{s_try_recv<std::string>(socket)};
        if (r.has_value()) {
            result = *r;
        } else {
            check_task_status(connection_id);
        }
    }

    auto res = json::parse(result);
    if (this->raw_json) {
        std::cout << res.dump(4) << std::endl;
        return;
    }

    if (res["type"] == "select" && res.find("iterator") == res.end()) {
        for (const auto &file : res["result"]["files"]) {
            std::cout << file.get<std::string>() << std::endl;
        }
    } else if (res["type"] == "topology") {
        for (const auto &item : res["result"]["datasets"].items()) {
            std::cout << "dataset " << item.key() << " ";
            std::cout << "[" << std::setw(10)
                      << item.value()["file_count"].get<int>() << "]";
            for (const auto &ndx : item.value()["indexes"].items()) {
                std::cout << " (" << ndx.value()["type"].get<std::string>()
                          << ")";
            }
            std::cout << std::endl;
        }
    } else if (res["type"] == "status") {
        for (const auto &item : res["result"]["tasks"].items()) {
            const auto &task = item.value();
            uint64_t estimated = task["work_estimated"];
            uint64_t done = task["work_done"];
            uint64_t id = task["id"];
            int done_per_10 = 0;
            if (estimated != 0) {
                done_per_10 = done * 10 / estimated;
            }
            std::cout << "task " << std::setw(9) << id;
            std::cout << " [";
            for (int i = 0; i < 10; i++) {
                std::cout << ((i < done_per_10) ? "#" : " ");
            }
            std::cout << "] ";
            std::string req = task["request"];
            if (req.size() <= 110) {
                std::cout << req;
            } else {
                std::cout << req.substr(0, 53);
                std::cout << " (...) ";
                std::cout << req.substr(req.size() - 50, 50);
            }
            std::cout << std::endl;
        }
    } else if (res["type"] == "error") {
        spdlog::error(res["error"]["message"].get<std::string>());
    } else {
        std::cout << res.dump(4) << std::endl;
    }
}